

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::JsonUnitTestResultPrinter::PrintJsonUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  int *piVar1;
  pointer ppTVar2;
  int iVar3;
  tm *ptVar4;
  long *plVar5;
  undefined8 *puVar6;
  ostream *poVar7;
  UnitTestImpl *pUVar8;
  bool bVar9;
  ulong *puVar10;
  TimeInMillis ms;
  pointer ppTVar11;
  pointer ppTVar12;
  ulong uVar13;
  undefined8 uVar14;
  uint uVar15;
  long lVar16;
  string local_2f0;
  int local_2cc;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  ulong *local_1e8;
  long local_1e0;
  ulong local_1d8;
  long lStack_1d0;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8;
  long lStack_1b0;
  long *local_1a8;
  undefined8 local_1a0;
  long local_198;
  undefined8 uStack_190;
  long *local_188;
  undefined8 local_180;
  long local_178;
  undefined8 uStack_170;
  long *local_168;
  undefined8 local_160;
  long local_158;
  undefined8 uStack_150;
  long *local_148;
  undefined8 local_140;
  long local_138;
  undefined8 uStack_130;
  ulong *local_128;
  long local_120;
  ulong local_118;
  long lStack_110;
  ulong *local_108;
  long local_100;
  ulong local_f8;
  long lStack_f0;
  ulong *local_e8;
  long local_e0;
  ulong local_d8;
  long lStack_d0;
  undefined1 local_c8 [8];
  string kTestsuites;
  string kIndent;
  long local_78;
  undefined8 uStack_70;
  undefined1 local_68 [8];
  tm time_struct;
  
  local_c8 = (undefined1  [8])&kTestsuites._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"testsuites","");
  kTestsuites.field_2._8_8_ = &kIndent._M_string_length;
  std::__cxx11::string::_M_construct((ulong)((long)&kTestsuites.field_2 + 8),'\x02');
  std::__ostream_insert<char,std::char_traits<char>>(stream,"{\n",2);
  piVar1 = &time_struct.tm_hour;
  local_68 = (undefined1  [8])piVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"tests","");
  iVar3 = UnitTestImpl::reportable_test_count(unit_test->impl_);
  OutputJsonKey(stream,(string *)local_c8,(string *)local_68,iVar3,
                (string *)((long)&kTestsuites.field_2 + 8),true);
  if (local_68 != (undefined1  [8])piVar1) {
    operator_delete((void *)local_68,CONCAT44(time_struct.tm_mday,time_struct.tm_hour) + 1);
  }
  local_68 = (undefined1  [8])piVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"failures","");
  iVar3 = UnitTestImpl::failed_test_count(unit_test->impl_);
  OutputJsonKey(stream,(string *)local_c8,(string *)local_68,iVar3,
                (string *)((long)&kTestsuites.field_2 + 8),true);
  if (local_68 != (undefined1  [8])piVar1) {
    operator_delete((void *)local_68,CONCAT44(time_struct.tm_mday,time_struct.tm_hour) + 1);
  }
  local_68 = (undefined1  [8])piVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"disabled","");
  iVar3 = UnitTestImpl::reportable_disabled_test_count(unit_test->impl_);
  OutputJsonKey(stream,(string *)local_c8,(string *)local_68,iVar3,
                (string *)((long)&kTestsuites.field_2 + 8),true);
  if (local_68 != (undefined1  [8])piVar1) {
    operator_delete((void *)local_68,CONCAT44(time_struct.tm_mday,time_struct.tm_hour) + 1);
  }
  local_68 = (undefined1  [8])piVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"errors","");
  OutputJsonKey(stream,(string *)local_c8,(string *)local_68,0,
                (string *)((long)&kTestsuites.field_2 + 8),true);
  if (local_68 != (undefined1  [8])piVar1) {
    operator_delete((void *)local_68,CONCAT44(time_struct.tm_mday,time_struct.tm_hour) + 1);
  }
  if (FLAGS_gtest_shuffle == '\x01') {
    local_68 = (undefined1  [8])piVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"random_seed","");
    OutputJsonKey(stream,(string *)local_c8,(string *)local_68,unit_test->impl_->random_seed_,
                  (string *)((long)&kTestsuites.field_2 + 8),true);
    if (local_68 != (undefined1  [8])piVar1) {
      operator_delete((void *)local_68,CONCAT44(time_struct.tm_mday,time_struct.tm_hour) + 1);
    }
  }
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"timestamp","");
  kIndent.field_2._8_8_ = unit_test->impl_->start_timestamp_ / 1000;
  ptVar4 = localtime_r((time_t *)(kIndent.field_2._M_local_buf + 8),(tm *)local_68);
  if (ptVar4 == (tm *)0x0) {
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    local_208._M_string_length = 0;
    local_208.field_2._M_allocated_capacity =
         local_208.field_2._M_allocated_capacity & 0xffffffffffffff00;
    goto LAB_001219f1;
  }
  local_2cc = time_struct.tm_mday + 0x76c;
  StreamableToString<int>(&local_2f0,&local_2cc);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2f0);
  puVar10 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar10) {
    local_d8 = *puVar10;
    lStack_d0 = plVar5[3];
    local_e8 = &local_d8;
  }
  else {
    local_d8 = *puVar10;
    local_e8 = (ulong *)*plVar5;
  }
  local_e0 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_2a8,(String *)(ulong)(time_struct.tm_hour + 1),(int)local_e0);
  uVar13 = 0xf;
  if (local_e8 != &local_d8) {
    uVar13 = local_d8;
  }
  if (uVar13 < local_2a8._M_string_length + local_e0) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      uVar14 = local_2a8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_2a8._M_string_length + local_e0) goto LAB_0012127a;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2a8,0,(char *)0x0,(ulong)local_e8);
  }
  else {
LAB_0012127a:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_2a8._M_dataplus._M_p);
  }
  local_148 = &local_138;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_138 = *plVar5;
    uStack_130 = puVar6[3];
  }
  else {
    local_138 = *plVar5;
    local_148 = (long *)*puVar6;
  }
  local_140 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_148);
  puVar10 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar10) {
    local_f8 = *puVar10;
    lStack_f0 = plVar5[3];
    local_108 = &local_f8;
  }
  else {
    local_f8 = *puVar10;
    local_108 = (ulong *)*plVar5;
  }
  local_100 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_288,(String *)(ulong)(uint)time_struct.tm_min,(int)local_100);
  uVar13 = 0xf;
  if (local_108 != &local_f8) {
    uVar13 = local_f8;
  }
  if (uVar13 < local_288._M_string_length + local_100) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      uVar14 = local_288.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_288._M_string_length + local_100) goto LAB_001213ac;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_288,0,(char *)0x0,(ulong)local_108);
  }
  else {
LAB_001213ac:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_288._M_dataplus._M_p);
  }
  local_168 = &local_158;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_158 = *plVar5;
    uStack_150 = puVar6[3];
  }
  else {
    local_158 = *plVar5;
    local_168 = (long *)*puVar6;
  }
  local_160 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_168);
  puVar10 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar10) {
    local_118 = *puVar10;
    lStack_110 = plVar5[3];
    local_128 = &local_118;
  }
  else {
    local_118 = *puVar10;
    local_128 = (ulong *)*plVar5;
  }
  local_120 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_268,(String *)(ulong)(uint)time_struct.tm_sec,(int)local_120);
  uVar13 = 0xf;
  if (local_128 != &local_118) {
    uVar13 = local_118;
  }
  if (uVar13 < local_268._M_string_length + local_120) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      uVar14 = local_268.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_268._M_string_length + local_120) goto LAB_001214de;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_128);
  }
  else {
LAB_001214de:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_268._M_dataplus._M_p);
  }
  local_188 = &local_178;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_178 = *plVar5;
    uStack_170 = puVar6[3];
  }
  else {
    local_178 = *plVar5;
    local_188 = (long *)*puVar6;
  }
  local_180 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_188);
  puVar10 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar10) {
    local_1b8 = *puVar10;
    lStack_1b0 = plVar5[3];
    local_1c8 = &local_1b8;
  }
  else {
    local_1b8 = *puVar10;
    local_1c8 = (ulong *)*plVar5;
  }
  local_1c0 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_(&local_248,(String *)((ulong)local_68 >> 0x20),(int)local_1c0);
  uVar13 = 0xf;
  if (local_1c8 != &local_1b8) {
    uVar13 = local_1b8;
  }
  if (uVar13 < local_248._M_string_length + local_1c0) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      uVar14 = local_248.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_248._M_string_length + local_1c0) goto LAB_00121610;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,(ulong)local_1c8);
  }
  else {
LAB_00121610:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_248._M_dataplus._M_p);
  }
  local_1a8 = &local_198;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_198 = *plVar5;
    uStack_190 = puVar6[3];
  }
  else {
    local_198 = *plVar5;
    local_1a8 = (long *)*puVar6;
  }
  local_1a0 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1a8);
  puVar10 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar10) {
    local_1d8 = *puVar10;
    lStack_1d0 = plVar5[3];
    local_1e8 = &local_1d8;
  }
  else {
    local_1d8 = *puVar10;
    local_1e8 = (ulong *)*plVar5;
  }
  local_1e0 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_228,(String *)((ulong)local_68 & 0xffffffff),(int)local_1e0);
  uVar13 = 0xf;
  if (local_1e8 != &local_1d8) {
    uVar13 = local_1d8;
  }
  if (uVar13 < local_228._M_string_length + local_1e0) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      uVar14 = local_228.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_228._M_string_length + local_1e0) goto LAB_00121741;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,(ulong)local_1e8);
  }
  else {
LAB_00121741:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)local_228._M_dataplus._M_p);
  }
  kIndent.field_2._8_8_ = &stack0xffffffffffffff88;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_78 = *plVar5;
    uStack_70 = puVar6[3];
  }
  else {
    local_78 = *plVar5;
    kIndent.field_2._8_8_ = (long *)*puVar6;
  }
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append(kIndent.field_2._M_local_buf + 8);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  puVar10 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_208.field_2._M_allocated_capacity = *puVar10;
    local_208.field_2._8_8_ = plVar5[3];
  }
  else {
    local_208.field_2._M_allocated_capacity = *puVar10;
    local_208._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_208._M_string_length = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((long *)kIndent.field_2._8_8_ != &stack0xffffffffffffff88) {
    operator_delete((void *)kIndent.field_2._8_8_,local_78 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,local_1d8 + 1);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,local_198 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,local_1b8 + 1);
  }
  if (local_188 != &local_178) {
    operator_delete(local_188,local_178 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,local_118 + 1);
  }
  if (local_168 != &local_158) {
    operator_delete(local_168,local_158 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108,local_f8 + 1);
  }
  if (local_148 != &local_138) {
    operator_delete(local_148,local_138 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,local_d8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
LAB_001219f1:
  OutputJsonKey(stream,(string *)local_c8,&local_2c8,&local_208,
                (string *)((long)&kTestsuites.field_2 + 8),true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  local_68 = (undefined1  [8])piVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"time","");
  FormatTimeInMillisAsDuration_abi_cxx11_
            ((string *)((long)&kIndent.field_2 + 8),(internal *)unit_test->impl_->elapsed_time_,ms);
  OutputJsonKey(stream,(string *)local_c8,(string *)local_68,(string *)((long)&kIndent.field_2 + 8),
                (string *)((long)&kTestsuites.field_2 + 8),false);
  if ((long *)kIndent.field_2._8_8_ != &stack0xffffffffffffff88) {
    operator_delete((void *)kIndent.field_2._8_8_,local_78 + 1);
  }
  if (local_68 != (undefined1  [8])piVar1) {
    operator_delete((void *)local_68,CONCAT44(time_struct.tm_mday,time_struct.tm_hour) + 1);
  }
  TestPropertiesAsJson
            ((string *)local_68,&unit_test->impl_->ad_hoc_test_result_,
             (string *)((long)&kTestsuites.field_2 + 8));
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(char *)local_68,CONCAT44(time_struct.tm_min,time_struct.tm_sec));
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,",\n",2);
  if (local_68 != (undefined1  [8])piVar1) {
    operator_delete((void *)local_68,CONCAT44(time_struct.tm_mday,time_struct.tm_hour) + 1);
  }
  local_68 = (undefined1  [8])piVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"name","");
  kIndent.field_2._8_8_ = &stack0xffffffffffffff88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&kIndent.field_2 + 8),"AllTests","");
  OutputJsonKey(stream,(string *)local_c8,(string *)local_68,(string *)((long)&kIndent.field_2 + 8),
                (string *)((long)&kTestsuites.field_2 + 8),true);
  if ((long *)kIndent.field_2._8_8_ != &stack0xffffffffffffff88) {
    operator_delete((void *)kIndent.field_2._8_8_,local_78 + 1);
  }
  if (local_68 != (undefined1  [8])piVar1) {
    operator_delete((void *)local_68,CONCAT44(time_struct.tm_mday,time_struct.tm_hour) + 1);
  }
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(char *)kTestsuites.field_2._8_8_,(long)kIndent._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(char *)local_c8,(long)kTestsuites._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\": [\n",5);
  pUVar8 = unit_test->impl_;
  ppTVar11 = (pUVar8->test_cases_).
             super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pUVar8->test_cases_).
                              super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar11) >> 3)) {
    lVar16 = 0;
    bVar9 = false;
    do {
      ppTVar12 = (ppTVar11[lVar16]->test_info_list_).
                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppTVar2 = *(pointer *)
                 ((long)&(ppTVar11[lVar16]->test_info_list_).
                         super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                         ._M_impl + 8);
      if (ppTVar12 != ppTVar2) {
        iVar3 = 0;
        do {
          uVar15 = (*ppTVar12)->is_in_another_shard_ ^ 1;
          if ((*ppTVar12)->matches_filter_ == false) {
            uVar15 = 0;
          }
          iVar3 = iVar3 + uVar15;
          ppTVar12 = ppTVar12 + 1;
        } while (ppTVar12 != ppTVar2);
        if (iVar3 != 0) {
          if (bVar9) {
            std::__ostream_insert<char,std::char_traits<char>>(stream,",\n",2);
            pUVar8 = unit_test->impl_;
          }
          PrintJsonTestCase(stream,(pUVar8->test_cases_).
                                   super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar16]);
          pUVar8 = unit_test->impl_;
          bVar9 = true;
        }
      }
      lVar16 = lVar16 + 1;
      ppTVar11 = (pUVar8->test_cases_).
                 super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (lVar16 < (int)((ulong)((long)(pUVar8->test_cases_).
                                          super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)ppTVar11) >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(char *)kTestsuites.field_2._8_8_,(long)kIndent._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}\n",2);
  if ((size_type *)kTestsuites.field_2._8_8_ != &kIndent._M_string_length) {
    operator_delete((void *)kTestsuites.field_2._8_8_,kIndent._M_string_length + 1);
  }
  if (local_c8 != (undefined1  [8])&kTestsuites._M_string_length) {
    operator_delete((void *)local_c8,kTestsuites._M_string_length + 1);
  }
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonUnitTest(std::ostream* stream,
                                                  const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";

  OutputJsonKey(stream, kTestsuites, "tests", unit_test.reportable_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "failures", unit_test.failed_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "disabled",
                unit_test.reportable_disabled_test_count(), kIndent);
  OutputJsonKey(stream, kTestsuites, "errors", 0, kIndent);
  if (GTEST_FLAG(shuffle)) {
    OutputJsonKey(stream, kTestsuites, "random_seed", unit_test.random_seed(),
                  kIndent);
  }
  OutputJsonKey(stream, kTestsuites, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(unit_test.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "time",
                FormatTimeInMillisAsDuration(unit_test.elapsed_time()), kIndent,
                false);

  *stream << TestPropertiesAsJson(unit_test.ad_hoc_test_result(), kIndent)
          << ",\n";

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  bool comma = false;
  for (int i = 0; i < unit_test.total_test_case_count(); ++i) {
    if (unit_test.GetTestCase(i)->reportable_test_count() > 0) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      PrintJsonTestCase(stream, *unit_test.GetTestCase(i));
    }
  }

  *stream << "\n" << kIndent << "]\n" << "}\n";
}